

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.cpp
# Opt level: O2

void amrex::Warning_host(char *msg)

{
  ostringstream *poVar1;
  Print PStack_198;
  
  if (msg != (char *)0x0) {
    Print::Print(&PStack_198,-1,(ostream *)system::oserr);
    poVar1 = &PStack_198.ss;
    std::operator<<((ostream *)poVar1,msg);
    std::operator<<((ostream *)poVar1,'!');
    std::operator<<((ostream *)poVar1,'\n');
    Print::~Print(&PStack_198);
  }
  return;
}

Assistant:

void
amrex::Warning_host (const char * msg)
{
    if (msg) {
        amrex::Print(Print::AllProcs,amrex::ErrorStream()) << msg << '!' << '\n';
    }
}